

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O1

exr_result_t
exr_copy_unset_attributes
          (exr_context_t ctxt,int part_index,exr_const_context_t source,int src_part_index)

{
  undefined8 uVar1;
  uint32_t *puVar2;
  anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0 aVar3;
  _func_exr_result_t_exr_context_t_void_ptr_int32_t_int32_t_ptr_void_ptr_ptr *p_Var4;
  _func_exr_result_t_exr_context_t_void_ptr_int32_t_int32_t_ptr_void_ptr *p_Var5;
  float fVar6;
  float fVar7;
  exr_result_t eVar8;
  int iVar9;
  exr_attribute_t **ppeVar10;
  exr_attr_chromaticities_t *peVar11;
  exr_attr_opaquedata_t *peVar12;
  exr_attribute_type_t type;
  undefined4 in_register_0000000c;
  undefined8 *puVar13;
  float *pfVar14;
  ulong uVar15;
  size_t __n;
  char *pcVar16;
  void *__src;
  _internal_exr_part *curpart;
  exr_attr_box2i_t *__dest;
  code *UNRECOVERED_JUMPTABLE;
  long lVar17;
  long lVar18;
  bool bVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  exr_attribute_t *attr;
  exr_attribute_t *local_e8;
  ulong local_e0;
  exr_attribute_list_t *local_d8;
  char *local_d0;
  _internal_exr_part *local_c8;
  undefined8 local_c0;
  exr_attribute_t **local_b8;
  exr_attribute_t **local_b0;
  exr_attribute_t **local_a8;
  exr_attribute_t **local_a0;
  exr_attribute_t **local_98;
  exr_attribute_t **local_90;
  exr_attribute_t **local_88;
  exr_attribute_t **local_80;
  exr_attribute_t **local_78;
  exr_attribute_t **local_70;
  exr_attribute_t *local_68;
  exr_attr_box2i_t *local_60;
  exr_attr_box2i_t *local_58;
  exr_attribute_t **local_50;
  exr_attribute_t **local_48;
  exr_attribute_t **local_40;
  long local_38;
  
  eVar8 = 2;
  if (ctxt != (exr_context_t)0x0) {
    uVar15 = (ulong)(uint)part_index;
    if ((part_index < 0) || (*(int *)(ctxt + 0xc4) <= part_index)) {
      UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x48);
      pcVar16 = "Part index (%d) out of range";
LAB_00117786:
      eVar8 = (*UNRECOVERED_JUMPTABLE)(ctxt,4,pcVar16,uVar15,UNRECOVERED_JUMPTABLE);
      return eVar8;
    }
    if (source != (exr_const_context_t)0x0) {
      if ((src_part_index < 0) || (*(int *)(source + 0xc4) <= src_part_index)) {
        UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x48);
        pcVar16 = "Source part index (%d) out of range";
        uVar15 = CONCAT44(in_register_0000000c,src_part_index);
        goto LAB_00117786;
      }
      curpart = *(_internal_exr_part **)(*(long *)(ctxt + 0x1d8) + uVar15 * 8);
      lVar17 = *(long *)(*(long *)(source + 0x1d8) + (ulong)(uint)src_part_index * 8);
      if (*(int *)(lVar17 + 8) < 1) {
        eVar8 = 0;
        bVar19 = true;
      }
      else {
        local_d8 = &curpart->attributes;
        local_70 = &curpart->version;
        local_a8 = &curpart->type;
        local_78 = &curpart->tiles;
        local_b0 = &curpart->screenWindowWidth;
        local_80 = &curpart->screenWindowCenter;
        local_88 = &curpart->pixelAspectRatio;
        local_90 = &curpart->name;
        local_98 = &curpart->lineOrder;
        local_48 = &curpart->displayWindow;
        local_60 = &curpart->display_window;
        local_40 = &curpart->dataWindow;
        local_58 = &curpart->data_window;
        local_b8 = &curpart->chunkCount;
        local_50 = &curpart->compression;
        local_a0 = &curpart->channels;
        local_c0 = 0;
        lVar18 = 0;
        local_c8 = curpart;
        local_38 = lVar17;
        do {
          puVar13 = *(undefined8 **)(*(long *)(lVar17 + 0x10) + lVar18 * 8);
          local_68 = (exr_attribute_t *)0x0;
          eVar8 = exr_attr_list_find_by_name(ctxt,local_d8,(char *)*puVar13,&local_68);
          if (eVar8 != 0xf) {
            eVar8 = 0;
            goto LAB_0011774d;
          }
          pcVar16 = (char *)*puVar13;
          local_e8 = (exr_attribute_t *)0x0;
          type = *(exr_attribute_type_t *)((long)puVar13 + 0x14);
          uVar15 = (ulong)type;
          eVar8 = 0x20;
          switch(*pcVar16) {
          case 'c':
            local_e0 = uVar15;
            iVar9 = strcmp(pcVar16,"channels");
            if (iVar9 == 0) {
              type = (exr_attribute_type_t)local_e0;
              eVar8 = exr_attr_list_add_static_name
                                (ctxt,local_d8,"channels",type,0,(uint8_t **)0x0,local_a0);
              ppeVar10 = local_a0;
            }
            else {
              iVar9 = strcmp(pcVar16,"compression");
              ppeVar10 = local_50;
              if (iVar9 == 0) {
                type = (exr_attribute_type_t)local_e0;
                local_d0 = pcVar16;
                eVar8 = exr_attr_list_add_static_name
                                  (ctxt,local_d8,"compression",type,0,(uint8_t **)0x0,local_50);
                local_e8 = *ppeVar10;
                pcVar16 = local_d0;
                if (eVar8 == 0) {
                  local_c8->comp_type = (uint)*(byte *)(puVar13 + 3);
LAB_00117535:
                  eVar8 = 0;
                  pcVar16 = local_d0;
                }
                break;
              }
              iVar9 = strcmp(pcVar16,"chunkCount");
              if (iVar9 != 0) goto LAB_001172a4;
              type = (exr_attribute_type_t)local_e0;
              eVar8 = exr_attr_list_add_static_name
                                (ctxt,local_d8,"chunkCount",type,0,(uint8_t **)0x0,local_b8);
              ppeVar10 = local_b8;
            }
            goto LAB_001173f8;
          case 'd':
            local_e0 = uVar15;
            iVar9 = strcmp(pcVar16,"dataWindow");
            ppeVar10 = local_40;
            if (iVar9 == 0) {
              type = (exr_attribute_type_t)local_e0;
              local_d0 = pcVar16;
              eVar8 = exr_attr_list_add_static_name
                                (ctxt,local_d8,"dataWindow",type,0,(uint8_t **)0x0,local_40);
              local_e8 = *ppeVar10;
              local_c0 = 1;
              pcVar16 = local_d0;
              if (eVar8 == 0) {
                aVar3 = ((anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0 *)puVar13[3])[1];
                (local_58->min).field_0 =
                     *(anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0 *)puVar13[3];
                (local_58->max).field_0 = aVar3;
              }
            }
            else {
              local_d0 = pcVar16;
              iVar9 = strcmp(pcVar16,"displayWindow");
              ppeVar10 = local_48;
              type = (exr_attribute_type_t)local_e0;
              pcVar16 = local_d0;
              if (iVar9 == 0) {
                eVar8 = exr_attr_list_add_static_name
                                  (ctxt,local_d8,"displayWindow",type,0,(uint8_t **)0x0,local_48);
                local_e8 = *ppeVar10;
                pcVar16 = local_d0;
                if (eVar8 == 0) {
                  aVar3 = ((anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0 *)puVar13[3])[1];
                  (local_60->min).field_0 =
                       *(anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0 *)puVar13[3];
                  (local_60->max).field_0 = aVar3;
                  goto LAB_00117535;
                }
              }
            }
            break;
          case 'e':
          case 'f':
          case 'g':
          case 'h':
          case 'i':
          case 'j':
          case 'k':
          case 'm':
          case 'o':
          case 'q':
          case 'r':
          case 'u':
            local_e0 = uVar15;
            break;
          case 'l':
            local_e0 = uVar15;
            iVar9 = strcmp(pcVar16,"lineOrder");
            if (iVar9 == 0) {
              type = (exr_attribute_type_t)local_e0;
              eVar8 = exr_attr_list_add_static_name
                                (ctxt,local_d8,"lineOrder",type,0,(uint8_t **)0x0,local_98);
              local_e8 = *local_98;
              if (eVar8 == 0) {
                local_c8->lineorder = (uint)*(byte *)(puVar13 + 3);
                eVar8 = 0;
              }
            }
            else {
LAB_001172a4:
              type = (exr_attribute_type_t)local_e0;
            }
            break;
          case 'n':
            local_e0 = uVar15;
            iVar9 = strcmp(pcVar16,"name");
            if (iVar9 != 0) goto LAB_001172a4;
            type = (exr_attribute_type_t)local_e0;
            eVar8 = exr_attr_list_add_static_name
                              (ctxt,local_d8,"name",type,0,(uint8_t **)0x0,local_90);
            ppeVar10 = local_90;
            goto LAB_001173f8;
          case 'p':
            local_e0 = uVar15;
            iVar9 = strcmp(pcVar16,"pixelAspectRatio");
            if (iVar9 != 0) goto LAB_001172a4;
            type = (exr_attribute_type_t)local_e0;
            eVar8 = exr_attr_list_add_static_name
                              (ctxt,local_d8,"pixelAspectRatio",type,0,(uint8_t **)0x0,local_88);
            ppeVar10 = local_88;
            goto LAB_001173f8;
          case 's':
            local_e0 = uVar15;
            iVar9 = strcmp(pcVar16,"screenWindowCenter");
            if (iVar9 == 0) {
              type = (exr_attribute_type_t)local_e0;
              eVar8 = exr_attr_list_add_static_name
                                (ctxt,local_d8,"screenWindowCenter",type,0,(uint8_t **)0x0,local_80)
              ;
              ppeVar10 = local_80;
            }
            else {
              iVar9 = strcmp(pcVar16,"screenWindowWidth");
              if (iVar9 != 0) goto LAB_001172a4;
              type = (exr_attribute_type_t)local_e0;
              eVar8 = exr_attr_list_add_static_name
                                (ctxt,local_d8,"screenWindowWidth",type,0,(uint8_t **)0x0,local_b0);
              ppeVar10 = local_b0;
            }
            goto LAB_001173f8;
          case 't':
            local_e0 = uVar15;
            iVar9 = strcmp(pcVar16,"tiles");
            if (iVar9 != 0) {
              iVar9 = strcmp(pcVar16,"type");
              if (iVar9 != 0) goto LAB_001172a4;
              type = (exr_attribute_type_t)local_e0;
              eVar8 = exr_attr_list_add_static_name
                                (ctxt,local_d8,"type",type,0,(uint8_t **)0x0,local_a8);
              ppeVar10 = local_a8;
              goto LAB_001173f8;
            }
            type = (exr_attribute_type_t)local_e0;
            eVar8 = exr_attr_list_add_static_name
                              (ctxt,local_d8,"tiles",type,0,(uint8_t **)0x0,local_78);
            local_e8 = *local_78;
            local_c0 = 1;
            break;
          case 'v':
            local_e0 = uVar15;
            iVar9 = strcmp(pcVar16,"version");
            if (iVar9 != 0) goto LAB_001172a4;
            type = (exr_attribute_type_t)local_e0;
            eVar8 = exr_attr_list_add_static_name
                              (ctxt,local_d8,"version",type,0,(uint8_t **)0x0,local_70);
            ppeVar10 = local_70;
LAB_001173f8:
            local_e8 = *ppeVar10;
          }
          if ((eVar8 == 0x20) && (local_e8 == (exr_attribute_t *)0x0)) {
            eVar8 = exr_attr_list_add(ctxt,local_d8,pcVar16,type,0,(uint8_t **)0x0,&local_e8);
          }
          lVar17 = local_38;
          if (eVar8 != 0) goto LAB_0011774d;
          switch(type) {
          case EXR_ATTR_BOX2I:
          case EXR_ATTR_BOX2F:
          case EXR_ATTR_V2D:
            peVar12 = (exr_attr_opaquedata_t *)(local_e8->field_6).chromaticities;
            pfVar14 = (float *)puVar13[3];
            goto LAB_0011756f;
          case EXR_ATTR_CHLIST:
            eVar8 = exr_attr_chlist_duplicate
                              (ctxt,(local_e8->field_6).chlist,(exr_attr_chlist_t *)puVar13[3]);
            break;
          case EXR_ATTR_CHROMATICITIES:
            peVar12 = (exr_attr_opaquedata_t *)(local_e8->field_6).chromaticities;
            pfVar14 = (float *)puVar13[3];
            goto LAB_00117690;
          case EXR_ATTR_COMPRESSION:
          case EXR_ATTR_ENVMAP:
          case EXR_ATTR_LINEORDER:
            (local_e8->field_6).uc = *(uint8_t *)(puVar13 + 3);
            goto LAB_0011769e;
          case EXR_ATTR_DOUBLE:
            local_e8->field_6 = *(anon_union_8_28_c8f53a7d_for_exr_attribute_t_6 *)(puVar13 + 3);
            goto LAB_0011769e;
          case EXR_ATTR_FLOAT:
            (local_e8->field_6).f = *(float *)(puVar13 + 3);
            goto LAB_0011769e;
          case EXR_ATTR_FLOAT_VECTOR:
            eVar8 = exr_attr_float_vector_create
                              (ctxt,(local_e8->field_6).floatvector,
                               *(float **)((int32_t *)puVar13[3] + 2),*(int32_t *)puVar13[3]);
            break;
          case EXR_ATTR_INT:
            (local_e8->field_6).f = *(float *)(puVar13 + 3);
            goto LAB_0011769e;
          case EXR_ATTR_KEYCODE:
            peVar12 = (exr_attr_opaquedata_t *)(local_e8->field_6).chromaticities;
            pfVar14 = (float *)puVar13[3];
            fVar20 = *pfVar14;
            fVar21 = pfVar14[1];
            fVar22 = pfVar14[2];
            fVar23 = pfVar14[3];
            uVar1 = *(undefined8 *)(pfVar14 + 5);
            *(undefined8 *)peVar12->pad = *(undefined8 *)(pfVar14 + 3);
            *(undefined8 *)((long)&peVar12->packed_data + 4) = uVar1;
            goto LAB_0011769b;
          case EXR_ATTR_M33F:
            peVar12 = (exr_attr_opaquedata_t *)(local_e8->field_6).m33f;
            pfVar14 = (float *)puVar13[3];
            *(float *)&peVar12->unpack_func_ptr = pfVar14[8];
LAB_00117690:
            fVar20 = *pfVar14;
            fVar21 = pfVar14[1];
            fVar22 = pfVar14[2];
            fVar23 = pfVar14[3];
            fVar24 = pfVar14[4];
            fVar25 = pfVar14[5];
            fVar26 = pfVar14[6];
            fVar27 = pfVar14[7];
LAB_00117697:
            *(float *)&peVar12->packed_data = fVar24;
            *(float *)((long)&peVar12->packed_data + 4) = fVar25;
            *(float *)&peVar12->unpacked_data = fVar26;
            *(float *)((long)&peVar12->unpacked_data + 4) = fVar27;
            goto LAB_0011769b;
          case EXR_ATTR_M33D:
            __dest = (local_e8->field_6).box2i;
            __src = (void *)puVar13[3];
            __n = 0x48;
            goto LAB_0011759d;
          case EXR_ATTR_M44F:
            peVar12 = (exr_attr_opaquedata_t *)(local_e8->field_6).m33d;
            pfVar14 = (float *)puVar13[3];
            fVar20 = *pfVar14;
            fVar21 = pfVar14[1];
            fVar22 = pfVar14[2];
            fVar23 = pfVar14[3];
            fVar24 = pfVar14[4];
            fVar25 = pfVar14[5];
            fVar26 = pfVar14[6];
            fVar27 = pfVar14[7];
            p_Var4 = *(_func_exr_result_t_exr_context_t_void_ptr_int32_t_int32_t_ptr_void_ptr_ptr **
                      )(pfVar14 + 8);
            p_Var5 = *(_func_exr_result_t_exr_context_t_void_ptr_int32_t_int32_t_ptr_void_ptr **)
                      (pfVar14 + 10);
            fVar6 = pfVar14[0xe];
            fVar7 = pfVar14[0xf];
            peVar12->destroy_unpacked_func_ptr =
                 *(_func_void_exr_context_t_void_ptr_int32_t **)(pfVar14 + 0xc);
            peVar12[1].size = (int32_t)fVar6;
            peVar12[1].unpacked_size = (int32_t)fVar7;
            peVar12->unpack_func_ptr = p_Var4;
            peVar12->pack_func_ptr = p_Var5;
            goto LAB_00117697;
          case EXR_ATTR_M44D:
            __dest = (local_e8->field_6).box2i;
            __src = (void *)puVar13[3];
            __n = 0x80;
LAB_0011759d:
            memcpy(__dest,__src,__n);
            goto LAB_0011769e;
          case EXR_ATTR_PREVIEW:
            puVar2 = (uint32_t *)puVar13[3];
            eVar8 = exr_attr_preview_create
                              (ctxt,(local_e8->field_6).preview,*puVar2,puVar2[1],
                               *(uint8_t **)(puVar2 + 4));
            break;
          case EXR_ATTR_RATIONAL:
          case EXR_ATTR_TIMECODE:
          case EXR_ATTR_V2I:
          case EXR_ATTR_V2F:
            peVar11 = (exr_attr_chromaticities_t *)(local_e8->field_6).box2i;
            puVar13 = (undefined8 *)puVar13[3];
            goto LAB_001175e8;
          case EXR_ATTR_STRING:
            eVar8 = exr_attr_string_create_with_length
                              (ctxt,(local_e8->field_6).string,*(char **)((int32_t *)puVar13[3] + 2)
                               ,*(int32_t *)puVar13[3]);
            break;
          case EXR_ATTR_STRING_VECTOR:
            eVar8 = exr_attr_string_vector_copy
                              (ctxt,(local_e8->field_6).stringvector,
                               (exr_attr_string_vector_t *)puVar13[3]);
            break;
          case EXR_ATTR_TILEDESC:
            peVar11 = (exr_attr_chromaticities_t *)(local_e8->field_6).tiledesc;
            puVar13 = (undefined8 *)puVar13[3];
            *(undefined1 *)&((exr_attr_v2i_t *)&peVar11->green_x)->field_0 =
                 *(undefined1 *)(puVar13 + 1);
            goto LAB_001175e8;
          case EXR_ATTR_V3I:
          case EXR_ATTR_V3F:
            peVar11 = (local_e8->field_6).chromaticities;
            puVar13 = (undefined8 *)puVar13[3];
            (((exr_attr_v2i_t *)&peVar11->green_x)->field_0).field_0.x = *(int32_t *)(puVar13 + 1);
LAB_001175e8:
            uVar1 = *puVar13;
            peVar11->red_x = (float)(int)uVar1;
            peVar11->red_y = (float)(int)((ulong)uVar1 >> 0x20);
            goto LAB_0011769e;
          case EXR_ATTR_V3D:
            peVar12 = (local_e8->field_6).opaque;
            pfVar14 = (float *)puVar13[3];
            peVar12->packed_data = *(void **)(pfVar14 + 4);
LAB_0011756f:
            fVar20 = *pfVar14;
            fVar21 = pfVar14[1];
            fVar22 = pfVar14[2];
            fVar23 = pfVar14[3];
LAB_0011769b:
            peVar12->size = (int32_t)fVar20;
            peVar12->unpacked_size = (int32_t)fVar21;
            peVar12->packed_alloc_size = (int32_t)fVar22;
            *(float *)peVar12->pad = fVar23;
LAB_0011769e:
            eVar8 = 0;
            break;
          case EXR_ATTR_OPAQUE:
            eVar8 = exr_attr_opaquedata_copy
                              (ctxt,(local_e8->field_6).opaque,(exr_attr_opaquedata_t *)puVar13[3]);
            break;
          default:
            eVar8 = (**(code **)(ctxt + 0x38))(ctxt,0xe);
          }
          lVar17 = local_38;
          if (eVar8 != 0) {
            exr_attr_list_remove(ctxt,local_d8,local_e8);
            lVar17 = local_38;
          }
LAB_0011774d:
        } while ((eVar8 == 0) && (lVar18 = lVar18 + 1, lVar18 < *(int *)(lVar17 + 8)));
        bVar19 = (int)local_c0 == 0;
        curpart = local_c8;
      }
      if (!bVar19) {
        eVar8 = internal_exr_compute_tile_information((_internal_exr_context *)ctxt,curpart,1);
      }
    }
  }
  return eVar8;
}

Assistant:

exr_result_t
exr_copy_unset_attributes (
    exr_context_t       ctxt,
    int                 part_index,
    exr_const_context_t source,
    int                 src_part_index)
{
    exr_result_t                        rv;
    const struct _internal_exr_context* srcctxt = EXR_CCTXT (source);
    struct _internal_exr_part*          srcpart;
    int                                 update_tiles = 0;
    EXR_PROMOTE_LOCKED_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);

    if (!srcctxt)
        return EXR_UNLOCK_AND_RETURN_PCTXT (EXR_ERR_MISSING_CONTEXT_ARG);
    if (srcctxt != pctxt) EXR_LOCK (srcctxt);

    if (src_part_index < 0 || src_part_index >= srcctxt->num_parts)
    {
        if (srcctxt != pctxt) EXR_UNLOCK (srcctxt);
        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
            pctxt,
            EXR_ERR_ARGUMENT_OUT_OF_RANGE,
            "Source part index (%d) out of range",
            src_part_index));
    }

    srcpart = srcctxt->parts[src_part_index];

    rv = EXR_ERR_SUCCESS;
    for (int a = 0;
         rv == EXR_ERR_SUCCESS && a < srcpart->attributes.num_attributes;
         ++a)
    {
        const exr_attribute_t* srca = srcpart->attributes.entries[a];
        exr_attribute_t*       attr = NULL;

        rv = exr_attr_list_find_by_name (
            ctxt,
            (exr_attribute_list_t*) &(part->attributes),
            srca->name,
            &attr);
        if (rv == EXR_ERR_NO_ATTR_BY_NAME)
        {
            rv = copy_attr (ctxt, pctxt, part, srca, &update_tiles);
        }
        else
        {
            rv = EXR_ERR_SUCCESS;
        }
    }

    if (update_tiles)
        rv = internal_exr_compute_tile_information (pctxt, part, 1);

    if (srcctxt != pctxt) EXR_UNLOCK (srcctxt);
    return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
}